

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_ss.c
# Opt level: O0

gdIOCtx * gdNewSSCtx(gdSourcePtr src,gdSinkPtr snk)

{
  ssIOCtxPtr ctx;
  gdSinkPtr snk_local;
  gdSourcePtr src_local;
  
  src_local = (gdSourcePtr)gdMalloc(0x50);
  if (src_local == (gdSourcePtr)0x0) {
    src_local = (gdSourcePtr)0x0;
  }
  else {
    src_local[4].source = (_func_int_void_ptr_char_ptr_int *)src;
    src_local[4].context = snk;
    src_local->source = sourceGetchar;
    src_local->context = sourceGetbuf;
    src_local[1].source = sinkPutchar;
    src_local[1].context = sinkPutbuf;
    src_local[2].context = (void *)0x0;
    src_local[2].source = (_func_int_void_ptr_char_ptr_int *)0x0;
    src_local[3].source = gdFreeSsCtx;
  }
  return (gdIOCtx *)src_local;
}

Assistant:

BGD_DECLARE(gdIOCtx *) gdNewSSCtx(gdSourcePtr src, gdSinkPtr snk)
{
	ssIOCtxPtr ctx;

	ctx = (ssIOCtxPtr)gdMalloc(sizeof (ssIOCtx));
	if (ctx == NULL) {
		return NULL;
	}

	ctx->src = src;
	ctx->snk = snk;

	ctx->ctx.getC = sourceGetchar;
	ctx->ctx.getBuf = sourceGetbuf;

	ctx->ctx.putC = sinkPutchar;
	ctx->ctx.putBuf = sinkPutbuf;

	ctx->ctx.tell = NULL;
	ctx->ctx.seek = NULL;

	ctx->ctx.gd_free = gdFreeSsCtx;

	return (gdIOCtx *)ctx;
}